

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

bool __thiscall wallet::WalletBatch::WriteBestBlock(WalletBatch *this,CBlockLocator *locator)

{
  bool bVar1;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  CBlockLocator *in_stack_ffffffffffffff98;
  undefined1 fOverwrite;
  CBlockLocator *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  WalletBatch *in_stack_ffffffffffffffc0;
  CBlockLocator local_28;
  long local_8;
  
  fOverwrite = (undefined1)((ulong)in_RDI >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  value = &local_28;
  CBlockLocator::CBlockLocator(in_stack_ffffffffffffff98);
  WriteIC<std::__cxx11::string,CBlockLocator>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,value,(bool)fOverwrite);
  CBlockLocator::~CBlockLocator(in_stack_ffffffffffffff98);
  bVar1 = WriteIC<std::__cxx11::string,CBlockLocator>
                    (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,value,(bool)fOverwrite);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteBestBlock(const CBlockLocator& locator)
{
    WriteIC(DBKeys::BESTBLOCK, CBlockLocator()); // Write empty block locator so versions that require a merkle branch automatically rescan
    return WriteIC(DBKeys::BESTBLOCK_NOMERKLE, locator);
}